

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

_Bool obj_kind_can_browse(object_kind *kind)

{
  ulong uVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = (ulong)(player->class->magic).num_books;
  bVar4 = 0 < (long)uVar1;
  if (0 < (long)uVar1) {
    pwVar2 = &((player->class->magic).books)->sval;
    uVar3 = 1;
    do {
      if ((kind->tval == ((class_book *)(pwVar2 + -1))->tval) && (kind->sval == *pwVar2)) {
        return bVar4;
      }
      bVar4 = uVar3 < uVar1;
      pwVar2 = pwVar2 + 8;
      bVar5 = uVar3 != uVar1;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

bool obj_kind_can_browse(const struct object_kind *kind)
{
	int i;

	for (i = 0; i < player->class->magic.num_books; i++) {
		struct class_book book = player->class->magic.books[i];
		if (kind->tval == book.tval && kind->sval == book.sval)
			return true;
	}

	return false;
}